

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsLoadMS::ReadMS<tcu::Vector<float,4>>
          (BasicAllTargetsLoadMS *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  GLenum GVar4;
  char *src_fs;
  bool bVar5;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var6;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  _Base_ptr local_158;
  undefined1 local_150;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_120;
  GLchar local_f8 [8];
  GLchar name [32];
  uint local_d0;
  uint local_cc;
  GLuint index;
  GLint uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  bool local_81;
  GLenum GStack_80;
  bool status;
  GLenum draw_buffers [3];
  GLuint fbo;
  int kSize;
  GLuint textures [2];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *value_local;
  BasicAllTargetsLoadMS *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsLoadMS *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSMS<tcu::Vector<float,4>>(&local_58,this,internalformat,expected_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar2;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),2,&fbo);
  draw_buffers[2] = 0x10;
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9100,fbo);
  glu::CallLogWrapper::glTexImage2DMultisample
            ((CallLogWrapper *)(this + 8),0x9100,4,value_local._4_4_,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9100,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9102,kSize);
  glu::CallLogWrapper::glTexImage3DMultisample
            ((CallLogWrapper *)(this + 8),0x9102,4,value_local._4_4_,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9102,0);
  glu::CallLogWrapper::glGenFramebuffers((CallLogWrapper *)(this + 8),1,draw_buffers + 1);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)(this + 8),0x8d40,draw_buffers[1]);
  glu::CallLogWrapper::glFramebufferTexture2D
            ((CallLogWrapper *)(this + 8),0x8d40,0x8ce0,0x9100,fbo,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            ((CallLogWrapper *)(this + 8),0x8d40,0x8ce1,kSize,0,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            ((CallLogWrapper *)(this + 8),0x8d40,0x8ce2,kSize,0,1);
  _GStack_80 = 0x8ce100008ce0;
  draw_buffers[0] = 0x8ce2;
  glu::CallLogWrapper::glDrawBuffers((CallLogWrapper *)(this + 8),3,&GStack_80);
  gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ClearBuffer
            ((ShaderImageLoadStoreBase *)this,0x1800,0,expected_value_local);
  gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ClearBuffer
            ((ShaderImageLoadStoreBase *)this,0x1800,1,expected_value_local);
  gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ClearBuffer
            ((ShaderImageLoadStoreBase *)this,0x1800,2,expected_value_local);
  glu::CallLogWrapper::glDeleteFramebuffers((CallLogWrapper *)(this + 8),1,draw_buffers + 1);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,fbo,0,'\0',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,kSize,0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,4);
  glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),0.0,1.0,
             0.0,1.0);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                    ((ShaderImageLoadStoreBase *)this,0,0,0x10,0x10,
                     (vec4 *)((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                             + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&index);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)(this + 8),local_34,0x8b86,(GLint *)&local_cc);
  bVar5 = local_cc != 2;
  if (bVar5) {
    gl4cts::anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n",(ulong)local_cc);
  }
  local_81 = !bVar5 && ((bVar1 ^ 0xffU) & 1) == 0;
  for (local_d0 = 0; GVar2 = local_34, local_d0 < local_cc; local_d0 = local_d0 + 1) {
    glu::CallLogWrapper::glGetActiveUniformName
              ((CallLogWrapper *)(this + 8),local_34,local_d0,0x20,(GLsizei *)0x0,local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,local_f8,&local_141);
    std::make_pair<std::__cxx11::string,unsigned_int&>(&local_120,&local_140,&local_d0);
    _Var6 = std::
            map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::insert<std::pair<std::__cxx11::string,unsigned_int>>
                      ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&index,&local_120);
    local_158 = (_Base_ptr)_Var6.first._M_node;
    local_150 = _Var6.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"g_image_2dms",&local_179)
  ;
  GVar4 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<float,4>>
                    ((ShaderImageLoadStoreBase *)this,0x9100);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_178,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar4);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_81 = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"g_image_2dms_array",&local_1a1);
  GVar4 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<float,4>>
                    ((ShaderImageLoadStoreBase *)this,0x9102);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_1a0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar4);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_81 = false;
  }
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),2,&fbo);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&index);
  return local_81;
}

Assistant:

bool ReadMS(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMS(internalformat, expected_value).c_str());
		GLuint		 textures[2];
		glGenTextures(2, textures);

		const int kSize = 16;

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, internalformat, kSize, kSize, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, internalformat, kSize, kSize, 2, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 0);

		GLuint fbo;
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, textures[0], 0);
		glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, textures[1], 0, 0);
		glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, textures[1], 0, 1);
		const GLenum draw_buffers[3] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2 };
		glDrawBuffers(3, draw_buffers);
		ClearBuffer(GL_COLOR, 0, value);
		ClearBuffer(GL_COLOR, 1, value);
		ClearBuffer(GL_COLOR, 2, value);
		glDeleteFramebuffers(1, &fbo);

		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[1], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms_array"), 4);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		std::map<std::string, GLuint> name_index_map;
		GLint uniforms;
		glGetProgramiv(program, GL_ACTIVE_UNIFORMS, &uniforms);
		if (uniforms != 2)
		{
			status = false;
			Output("ACTIVE_UNIFORMS is %d should be 2.\n", uniforms);
		}
		for (GLuint index = 0; index < static_cast<GLuint>(uniforms); ++index)
		{
			GLchar name[32];
			glGetActiveUniformName(program, index, sizeof(name), NULL, name);
			name_index_map.insert(std::make_pair(std::string(name), index));
		}

		if (!CheckUniform(program, "g_image_2dms", name_index_map, 1, ImageType<T>(GL_TEXTURE_2D_MULTISAMPLE)))
			status = false;
		if (!CheckUniform(program, "g_image_2dms_array", name_index_map, 1,
						  ImageType<T>(GL_TEXTURE_2D_MULTISAMPLE_ARRAY)))
			status = false;

		glDeleteTextures(2, textures);
		glUseProgram(0);
		glDeleteProgram(program);

		return status;
	}